

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk7_attr.c
# Opt level: O0

int PKCS7_simple_smimecap(stack_st_X509_ALGOR *sk,int nid,int arg)

{
  int iVar1;
  X509_ALGOR *a;
  ASN1_OBJECT *pAVar2;
  ASN1_TYPE *pAVar3;
  X509_ALGOR *alg;
  ASN1_INTEGER *nbit;
  OPENSSL_STACK *in_stack_ffffffffffffffc8;
  OPENSSL_STACK *in_stack_ffffffffffffffd0;
  ASN1_INTEGER *a_00;
  
  a_00 = (ASN1_INTEGER *)0x0;
  a = X509_ALGOR_new();
  if (a == (X509_ALGOR *)0x0) {
    ERR_new();
    ERR_set_debug((char *)a_00,(int)((ulong)a >> 0x20),(char *)in_stack_ffffffffffffffd0);
    ERR_set_error(0x21,0xc0100,(char *)0x0);
    return 0;
  }
  ASN1_OBJECT_free(a->algorithm);
  pAVar2 = OBJ_nid2obj(nid);
  a->algorithm = pAVar2;
  if (0 < arg) {
    pAVar3 = ASN1_TYPE_new();
    a->parameter = pAVar3;
    if (((pAVar3 == (ASN1_TYPE *)0x0) || (a_00 = ASN1_INTEGER_new(), a_00 == (ASN1_INTEGER *)0x0))
       || (iVar1 = ASN1_INTEGER_set(a_00,(long)arg), iVar1 == 0)) goto LAB_004511a3;
    (a->parameter->value).integer = a_00;
    a->parameter->type = 2;
    a_00 = (ASN1_INTEGER *)0x0;
  }
  in_stack_ffffffffffffffd0 = ossl_check_X509_ALGOR_sk_type((stack_st_X509_ALGOR *)sk);
  ossl_check_X509_ALGOR_type((X509_ALGOR *)a);
  iVar1 = OPENSSL_sk_push(in_stack_ffffffffffffffc8,(void *)0x451192);
  if (iVar1 != 0) {
    return 1;
  }
LAB_004511a3:
  ERR_new();
  ERR_set_debug((char *)a_00,(int)((ulong)a >> 0x20),(char *)in_stack_ffffffffffffffd0);
  ERR_set_error(0x21,0xc0100,(char *)0x0);
  ASN1_INTEGER_free(a_00);
  X509_ALGOR_free(a);
  return 0;
}

Assistant:

int PKCS7_simple_smimecap(STACK_OF(X509_ALGOR) *sk, int nid, int arg)
{
    ASN1_INTEGER *nbit = NULL;
    X509_ALGOR *alg;

    if ((alg = X509_ALGOR_new()) == NULL) {
        ERR_raise(ERR_LIB_PKCS7, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    ASN1_OBJECT_free(alg->algorithm);
    alg->algorithm = OBJ_nid2obj(nid);
    if (arg > 0) {
        if ((alg->parameter = ASN1_TYPE_new()) == NULL) {
            goto err;
        }
        if ((nbit = ASN1_INTEGER_new()) == NULL) {
            goto err;
        }
        if (!ASN1_INTEGER_set(nbit, arg)) {
            goto err;
        }
        alg->parameter->value.integer = nbit;
        alg->parameter->type = V_ASN1_INTEGER;
        nbit = NULL;
    }
    if (!sk_X509_ALGOR_push(sk, alg)) {
        goto err;
    }
    return 1;
err:
    ERR_raise(ERR_LIB_PKCS7, ERR_R_MALLOC_FAILURE);
    ASN1_INTEGER_free(nbit);
    X509_ALGOR_free(alg);
    return 0;
}